

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::makeDeltaTicks(MidiFile *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  MidiEvent *pMVar5;
  long *plVar6;
  ostream *poVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  if (this->m_theTimeState != 0) {
    uVar3 = (long)(this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (uint)(uVar3 >> 3);
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)uVar9) {
      uVar10 = (long)(uVar3 * 0x20000000) >> 0x1e & 0xfffffffffffffffc;
    }
    pvVar4 = operator_new__(uVar10);
    if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        *(undefined4 *)((long)pvVar4 + uVar10 * 4) = 0;
        iVar1 = MidiEventList::size((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar10]);
        if (0 < iVar1) {
          pMVar5 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10],0);
          *(int *)((long)pvVar4 + uVar10 * 4) = pMVar5->tick;
          iVar1 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar10]);
          if (1 < iVar1) {
            iVar1 = 1;
            do {
              pMVar5 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10],iVar1);
              iVar2 = pMVar5->tick;
              iVar8 = iVar2 - *(int *)((long)pvVar4 + uVar10 * 4);
              if (iVar8 < 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: negative delta tick value: ",0x22);
                plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                std::ostream::put((char)plVar6);
                poVar7 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"Timestamps must be sorted first",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," (use MidiFile::sortTracks() before writing).",0x2d);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
              }
              pMVar5 = MidiEventList::operator[]
                                 ((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10],iVar1);
              pMVar5->tick = iVar8;
              *(int *)((long)pvVar4 + uVar10 * 4) = iVar2;
              iVar1 = iVar1 + 1;
              iVar2 = MidiEventList::size((this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar10]);
            } while (iVar1 < iVar2);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar9 & 0x7fffffff));
    }
    this->m_theTimeState = 0;
    operator_delete__(pvVar4);
    return;
  }
  return;
}

Assistant:

void MidiFile::makeDeltaTicks(void) {
	if (getTickState() == TIME_STATE_DELTA) {
		return;
	}
	int i, j;
	int temp;
	int length = getNumTracks();
	int *timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			temp = (*m_events[i])[j].tick;
			int deltatick = temp - timedata[i];
			if (deltatick < 0) {
				std::cerr << "Error: negative delta tick value: " << deltatick << std::endl
				     << "Timestamps must be sorted first"
				     << " (use MidiFile::sortTracks() before writing)." << std::endl;
			}
			(*m_events[i])[j].tick = deltatick;
			timedata[i] = temp;
		}
	}
	m_theTimeState = TIME_STATE_DELTA;
	delete [] timedata;
}